

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::GetTrim2dStart(ON_Brep *this,int trim_index,ON_2dPoint *P)

{
  bool bVar1;
  int iVar2;
  ON_BrepTrim *this_00;
  double *pdVar3;
  ON_Interval local_58;
  undefined1 local_48 [8];
  ON_3dPoint pp;
  ON_BrepTrim *trim;
  ON_2dPoint *P_local;
  int trim_index_local;
  ON_Brep *this_local;
  
  if ((-1 < trim_index) &&
     (iVar2 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
     trim_index < iVar2)) {
    this_00 = ON_ClassArray<ON_BrepTrim>::operator[]
                        ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,trim_index);
    pp.z = (double)this_00;
    (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    pdVar3 = ON_Interval::operator[](&local_58,0);
    bVar1 = ON_Curve::EvPoint((ON_Curve *)this_00,*pdVar3,(ON_3dPoint *)local_48,0,(int *)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ON_2dPoint::operator=(P,(ON_3dPoint *)local_48);
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool
ON_Brep::GetTrim2dStart(int trim_index,
                        ON_2dPoint& P
                        ) const

{
  if (trim_index < 0 || trim_index >= m_T.Count())
    return false;
  const ON_BrepTrim& trim = m_T[trim_index];
  ON_3dPoint pp;
  if (!trim.EvPoint(trim.Domain()[0], pp)) 
    return false;
  P = pp;
  return true;
}